

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O0

int __thiscall dit::anon_unknown_0::TrieParserTests::init(TrieParserTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  CaseListParserCase *pCVar1;
  NegativeCaseListCase *pNVar2;
  TrieParserTests *this_local;
  
  pCVar1 = (CaseListParserCase *)operator_new(0x88);
  CaseListParserCase::CaseListParserCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"single_case","{test}",
             init::subCases,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CaseListParserCase *)operator_new(0x88);
  CaseListParserCase::CaseListParserCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"simple_group_1","{a{b}}",
             (anonymous_namespace)::TrieParserTests::init()::subCases,4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CaseListParserCase *)operator_new(0x88);
  CaseListParserCase::CaseListParserCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"simple_group_2","{a{b,c}}"
             ,(anonymous_namespace)::TrieParserTests::init()::subCases,5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CaseListParserCase *)operator_new(0x88);
  CaseListParserCase::CaseListParserCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"two_groups",
             "{a{b},c{d,e}}",(anonymous_namespace)::TrieParserTests::init()::subCases,10);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CaseListParserCase *)operator_new(0x88);
  CaseListParserCase::CaseListParserCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"case_group","{a,c{d,e}}",
             (anonymous_namespace)::TrieParserTests::init()::subCases,10);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CaseListParserCase *)operator_new(0x88);
  CaseListParserCase::CaseListParserCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"group_case","{c{d,e},a}",
             (anonymous_namespace)::TrieParserTests::init()::subCases,10);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CaseListParserCase *)operator_new(0x88);
  CaseListParserCase::CaseListParserCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"trailing_cr","{test}\r",
             (anonymous_namespace)::TrieParserTests::init()::subCases,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CaseListParserCase *)operator_new(0x88);
  CaseListParserCase::CaseListParserCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"trailing_lf","{test}\n",
             (anonymous_namespace)::TrieParserTests::init()::subCases,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CaseListParserCase *)operator_new(0x88);
  CaseListParserCase::CaseListParserCase
            (pCVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"trailing_crlf",
             "{test}\r\n",(anonymous_namespace)::TrieParserTests::init()::subCases,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_string","");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_line","\n");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_root","{}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_group","{test{}}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_group_name_1","{{}}"
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_group_name_2",
             "{{test}}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unterminated_root_1","{");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unterminated_root_2",
             "{test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unterminated_root_3",
             "{test,");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unterminated_root_4",
             "{test{a}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unterminated_root_5",
             "{a,b");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unterminated_group_1",
             "{test{");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unterminated_group_2",
             "{test{a");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unterminated_group_3",
             "{test{a,");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unterminated_group_4",
             "{test{a,b");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_case_name_1",
             "{a,,b}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_case_name_2","{,b}")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_case_name_3","{a,}")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"no_separator","{a{b}c}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"invalid_char_1","{a.b}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"invalid_char_2","{a[]}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"trailing_char_1","{a}}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"trailing_char_2","{a}x");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"embedded_newline_1",
             "{\na}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"embedded_newline_2",
             "{a\n,b}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"embedded_newline_3",
             "{a,\nb}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"embedded_newline_4",
             "{a{b\n}}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  pNVar2 = (NegativeCaseListCase *)operator_new(0x78);
  NegativeCaseListCase::NegativeCaseListCase
            (pNVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"embedded_newline_5",
             "{a{b}\n}");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar2);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		{
			static const char* const	caseList	= "{test}";
			static const MatchCase		subCases[]	=
			{
				{ "test",		MatchCase::MATCH_CASE	},
				{ "test.cd",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "single_case", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{a{b}}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "simple_group_1", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{a{b,c}}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "simple_group_2", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{a{b},c{d,e}}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.c",	MatchCase::NO_MATCH		},
				{ "a.d",	MatchCase::NO_MATCH		},
				{ "a.e",	MatchCase::NO_MATCH		},
				{ "c",		MatchCase::MATCH_GROUP	},
				{ "c.b",	MatchCase::NO_MATCH		},
				{ "c.d",	MatchCase::MATCH_CASE	},
				{ "c.e",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "two_groups", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{a,c{d,e}}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_CASE	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::NO_MATCH		},
				{ "a.d",	MatchCase::NO_MATCH		},
				{ "a.e",	MatchCase::NO_MATCH		},
				{ "c",		MatchCase::MATCH_GROUP	},
				{ "c.b",	MatchCase::NO_MATCH		},
				{ "c.d",	MatchCase::MATCH_CASE	},
				{ "c.e",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "case_group", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{c{d,e},a}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_CASE	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::NO_MATCH		},
				{ "a.d",	MatchCase::NO_MATCH		},
				{ "a.e",	MatchCase::NO_MATCH		},
				{ "c",		MatchCase::MATCH_GROUP	},
				{ "c.b",	MatchCase::NO_MATCH		},
				{ "c.d",	MatchCase::MATCH_CASE	},
				{ "c.e",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "group_case", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{test}\r";
			static const MatchCase		subCases[]	=
			{
				{ "test",		MatchCase::MATCH_CASE	},
				{ "test.cd",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "trailing_cr", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{test}\n";
			static const MatchCase		subCases[]	=
			{
				{ "test",		MatchCase::MATCH_CASE	},
				{ "test.cd",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "trailing_lf", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{test}\r\n";
			static const MatchCase		subCases[]	=
			{
				{ "test",		MatchCase::MATCH_CASE	},
				{ "test.cd",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "trailing_crlf", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}

		// Negative tests
		addChild(new NegativeCaseListCase(m_testCtx, "empty_string",			""));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_line",				"\n"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_root",				"{}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_group",				"{test{}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_group_name_1",		"{{}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_group_name_2",		"{{test}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_1",		"{"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_2",		"{test"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_3",		"{test,"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_4",		"{test{a}"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_5",		"{a,b"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_group_1",	"{test{"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_group_2",	"{test{a"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_group_3",	"{test{a,"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_group_4",	"{test{a,b"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_case_name_1",		"{a,,b}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_case_name_2",		"{,b}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_case_name_3",		"{a,}"));
		addChild(new NegativeCaseListCase(m_testCtx, "no_separator",			"{a{b}c}"));
		addChild(new NegativeCaseListCase(m_testCtx, "invalid_char_1",			"{a.b}"));
		addChild(new NegativeCaseListCase(m_testCtx, "invalid_char_2",			"{a[]}"));
		addChild(new NegativeCaseListCase(m_testCtx, "trailing_char_1",			"{a}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "trailing_char_2",			"{a}x"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_1",		"{\na}"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_2",		"{a\n,b}"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_3",		"{a,\nb}"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_4",		"{a{b\n}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_5",		"{a{b}\n}"));
	}